

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O1

void __thiscall
rpc_tests::rpc_convert_values_generatetoaddress::test_method
          (rpc_convert_values_generatetoaddress *this)

{
  pointer pUVar1;
  int iVar2;
  UniValue *pUVar3;
  string *psVar4;
  long lVar5;
  pointer *ppbVar6;
  pointer pUVar7;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  iterator pvVar9;
  long in_FS_OFFSET;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  check_type cVar10;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char local_238 [4];
  undefined1 local_234 [20];
  char *local_220;
  char *local_218;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  char *local_198;
  string *local_190;
  pointer local_188;
  element_type *peStack_180;
  shared_count local_178 [2];
  undefined1 local_168 [8];
  bool local_160 [8];
  _func_int *local_158;
  undefined1 local_150 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  undefined1 local_128 [32];
  undefined1 local_108 [24];
  undefined1 local_f0 [8];
  long local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  vector<UniValue,_std::allocator<UniValue>_> local_c8;
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  UniValue local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_90.val._M_dataplus._M_p = (pointer)&local_90.val.field_2;
  local_90.val._M_string_length = 0;
  local_90.val.field_2._M_local_buf[0] = '\0';
  local_90.typ = VNULL;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0._0_8_ = &local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"generatetoaddress","");
  local_108._0_8_ = local_108 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"101","");
  ppbVar6 = &local_e0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_e8 = (long)ppbVar6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1b0,__l,(allocator_type *)&local_190);
  RPCConvertValues((UniValue *)local_168,(string *)local_b0,&local_1b0);
  local_90.typ = local_168._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_90.val,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160);
  local_178[0].pi_ =
       (sp_counted_base *)
       local_90.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  peStack_180 = (element_type *)
                local_90.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_188 = (pointer)local_90.keys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_140.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_140.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_140.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_140.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_140.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_140.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_188);
  local_178[0].pi_ =
       (sp_counted_base *)
       local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  peStack_180 = (element_type *)
                local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_188 = local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_128._0_8_;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_128._8_8_;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_128._16_8_;
  local_128._0_8_ = (pointer)0x0;
  local_128._8_8_ = (element_type *)0x0;
  local_128._16_8_ = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_188);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)local_128);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_140);
  if ((undefined1 *)CONCAT71(local_160._1_7_,local_160[0]) != local_150) {
    operator_delete((undefined1 *)CONCAT71(local_160._1_7_,local_160[0]),local_150._0_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b0);
  lVar5 = -0x40;
  do {
    if ((pointer)ppbVar6 != ppbVar6[-2]) {
      operator_delete(ppbVar6[-2],(ulong)((long)&((*ppbVar6)->_M_dataplus)._M_p + 1));
    }
    ppbVar6 = ppbVar6 + -4;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._0_8_ != &local_a0) {
    operator_delete((void *)local_b0._0_8_,(ulong)(local_a0._M_allocated_capacity + 1));
  }
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x57dc3f;
  file.m_end = (iterator)0x198;
  file.m_begin = (iterator)&local_1c0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1d0,msg);
  local_108[0] = 1;
  local_108._8_8_ = (element_type *)0x0;
  local_108._16_8_ = 0;
  local_160[0] = false;
  local_168 = (undefined1  [8])&PTR__lazy_ostream_013d77d0;
  local_158 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_150._0_8_ =
       "no exceptions thrown by result = RPCConvertValues(\"generatetoaddress\", {\"101\", \"mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a\"})"
  ;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1d8 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_108,(lazy_ostream *)local_168,1,1,WARN,_cVar10,
             (size_t)&local_1e0,0x198);
  boost::detail::shared_count::~shared_count((shared_count *)(local_108 + 0x10));
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_218 = "";
  local_234._4_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_234._12_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x199;
  file_00.m_begin = (iterator)&local_220;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)(local_234 + 4),
             msg_00);
  local_b0[8] = false;
  local_b0._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  pUVar3 = ::UniValue::operator[](&local_90,0);
  local_234._0_4_ = ::UniValue::getInt<int>(pUVar3);
  local_190 = (string *)local_234;
  local_198 = local_238;
  local_238[0] = 'e';
  local_238[1] = '\0';
  local_238[2] = '\0';
  local_238[3] = '\0';
  peStack_180 = (element_type *)0x0;
  local_178[0].pi_ = (sp_counted_base *)0x0;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xeeab46;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeeaba1;
  local_150._0_8_ = &local_190;
  local_160[0] = false;
  local_168 = (undefined1  [8])&PTR__lazy_ostream_013d3e70;
  local_158 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_f0 = (undefined1  [8])&local_198;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108._0_8_ = &PTR__lazy_ostream_013d3e70;
  local_108._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_188._0_1_ = (class_property<bool>)(class_property<bool>)(local_234._0_4_ == 0x65);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_188,(lazy_ostream *)local_b0,1,2,REQUIRE,0xeee48b,
             (size_t)&local_1b0,0x199,local_168,"101",local_108);
  boost::detail::shared_count::~shared_count(local_178);
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x19a;
  file_01.m_begin = (iterator)&local_248;
  msg_01.m_end = pvVar9;
  msg_01.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_258,
             msg_01);
  local_b0[8] = false;
  local_b0._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  pUVar3 = ::UniValue::operator[](&local_90,1);
  psVar4 = ::UniValue::get_str_abi_cxx11_(pUVar3);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (psVar4,"mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a");
  local_188 = (pointer)CONCAT71(local_188._1_7_,iVar2 == 0);
  peStack_180 = (element_type *)0x0;
  local_178[0].pi_ = (sp_counted_base *)0x0;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xeeab46;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeeaba1;
  local_160[0] = false;
  local_168 = (undefined1  [8])&PTR__lazy_ostream_013d3d70;
  local_158 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_150._0_8_ = &local_190;
  local_198 = "mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a";
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108._0_8_ = &PTR__lazy_ostream_013d43f0;
  local_108._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_f0 = (undefined1  [8])&local_198;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_190 = psVar4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_188,(lazy_ostream *)local_b0,1,2,REQUIRE,0xeee4a3,
             (size_t)&local_1b0,0x19a,local_168,"\"mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a\"",local_108);
  boost::detail::shared_count::~shared_count(local_178);
  local_b0._0_8_ = &local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"generatetoaddress","");
  local_108._0_8_ = local_108 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"101","");
  ppbVar6 = &local_e0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_e8 = (long)ppbVar6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU","");
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1b0,__l_00,(allocator_type *)&local_190);
  RPCConvertValues((UniValue *)local_168,(string *)local_b0,&local_1b0);
  local_90.typ = local_168._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_90.val,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160);
  local_178[0].pi_ =
       (sp_counted_base *)
       local_90.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  peStack_180 = (element_type *)
                local_90.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_188 = (pointer)local_90.keys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_140.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_140.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_140.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_140.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_140.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_140.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_188);
  local_178[0].pi_ =
       (sp_counted_base *)
       local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  peStack_180 = (element_type *)
                local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_188 = local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_128._0_8_;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_128._8_8_;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_128._16_8_;
  local_128._0_8_ = (pointer)0x0;
  local_128._8_8_ = (pointer)0x0;
  local_128._16_8_ = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_188);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)local_128);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_140);
  if ((undefined1 *)CONCAT71(local_160._1_7_,local_160[0]) != local_150) {
    operator_delete((undefined1 *)CONCAT71(local_160._1_7_,local_160[0]),local_150._0_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b0);
  lVar5 = -0x40;
  do {
    if ((pointer)ppbVar6 != ppbVar6[-2]) {
      operator_delete(ppbVar6[-2],(ulong)((long)&((*ppbVar6)->_M_dataplus)._M_p + 1));
    }
    ppbVar6 = ppbVar6 + -4;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._0_8_ != &local_a0) {
    operator_delete((void *)local_b0._0_8_,(ulong)(local_a0._M_allocated_capacity + 1));
  }
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x57e21f;
  file_02.m_end = (iterator)0x19c;
  file_02.m_begin = (iterator)&local_268;
  msg_02.m_end = pvVar9;
  msg_02.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_278,
             msg_02);
  local_108[0] = 1;
  local_108._8_8_ = (element_type *)0x0;
  local_108._16_8_ = 0;
  local_160[0] = false;
  local_168 = (undefined1  [8])&PTR__lazy_ostream_013d77d0;
  local_158 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_150._0_8_ =
       "no exceptions thrown by result = RPCConvertValues(\"generatetoaddress\", {\"101\", \"mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU\"})"
  ;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_280 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_108,(lazy_ostream *)local_168,1,1,WARN,_cVar10,
             (size_t)&local_288,0x19c);
  boost::detail::shared_count::~shared_count((shared_count *)(local_108 + 0x10));
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x19d;
  file_03.m_begin = (iterator)&local_2c8;
  msg_03.m_end = pvVar9;
  msg_03.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2d8,
             msg_03);
  local_b0[8] = false;
  local_b0._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  pUVar3 = ::UniValue::operator[](&local_90,0);
  local_234._0_4_ = ::UniValue::getInt<int>(pUVar3);
  local_238[0] = 'e';
  local_238[1] = '\0';
  local_238[2] = '\0';
  local_238[3] = '\0';
  peStack_180 = (element_type *)0x0;
  local_178[0].pi_ = (sp_counted_base *)0x0;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xeeab46;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeeaba1;
  local_190 = (string *)local_234;
  local_160[0] = false;
  local_168 = (undefined1  [8])&PTR__lazy_ostream_013d3e70;
  local_158 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_150._0_8_ = &local_190;
  local_198 = local_238;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108._0_8_ = &PTR__lazy_ostream_013d3e70;
  local_108._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_f0 = (undefined1  [8])&local_198;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_188._0_1_ = (class_property<bool>)(class_property<bool>)(local_234._0_4_ == 0x65);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_188,(lazy_ostream *)local_b0,1,2,REQUIRE,0xeee48b,
             (size_t)&local_1b0,0x19d,local_168,"101",local_108);
  boost::detail::shared_count::~shared_count(local_178);
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x19e;
  file_04.m_begin = (iterator)&local_2e8;
  msg_04.m_end = pvVar9;
  msg_04.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2f8,
             msg_04);
  local_b0[8] = false;
  local_b0._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  pUVar3 = ::UniValue::operator[](&local_90,1);
  psVar4 = ::UniValue::get_str_abi_cxx11_(pUVar3);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (psVar4,"mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU");
  local_188 = (pointer)CONCAT71(local_188._1_7_,iVar2 == 0);
  peStack_180 = (element_type *)0x0;
  local_178[0].pi_ = (sp_counted_base *)0x0;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xeeab46;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeeaba1;
  local_160[0] = false;
  local_168 = (undefined1  [8])&PTR__lazy_ostream_013d3d70;
  local_158 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_150._0_8_ = &local_190;
  local_198 = "mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU";
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108._0_8_ = &PTR__lazy_ostream_013d43f0;
  local_108._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_f0 = (undefined1  [8])&local_198;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_190 = psVar4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_188,(lazy_ostream *)local_b0,1,2,REQUIRE,0xeee4a3,
             (size_t)&local_1b0,0x19e,local_168,"\"mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU\"",local_108);
  boost::detail::shared_count::~shared_count(local_178);
  local_b0._0_8_ = &local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"generatetoaddress","");
  local_168 = (undefined1  [8])&local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"1","");
  local_150._8_8_ =
       &local_140.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_150 + 8),"mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a","");
  pUVar7 = (pointer)(local_128 + 0x10);
  local_128._0_8_ = pUVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"9","");
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_168;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1b0,__l_01,(allocator_type *)&local_190);
  RPCConvertValues((UniValue *)local_108,(string *)local_b0,&local_1b0);
  local_90.typ = local_108._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_90.val,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 8));
  local_178[0].pi_ =
       (sp_counted_base *)
       local_90.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  peStack_180 = (element_type *)
                local_90.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_188 = (pointer)local_90.keys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_188);
  local_178[0].pi_ =
       (sp_counted_base *)
       local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  peStack_180 = (element_type *)
                local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_188 = local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_188);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e0);
  if ((element_type *)local_108._8_8_ != (element_type *)local_f0) {
    operator_delete((void *)local_108._8_8_,(long)local_f0 + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b0);
  lVar5 = -0x60;
  do {
    pUVar1 = pUVar7[-1].values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pUVar7 != pUVar1) {
      operator_delete(pUVar1,*(long *)pUVar7 + 1);
    }
    pUVar7 = (pointer)&pUVar7[-1].keys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._0_8_ != &local_a0) {
    operator_delete((void *)local_b0._0_8_,(ulong)(local_a0._M_allocated_capacity + 1));
  }
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x57e843;
  file_05.m_end = (iterator)0x1a0;
  file_05.m_begin = (iterator)&local_308;
  msg_05.m_end = pvVar9;
  msg_05.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_318,
             msg_05);
  local_108[0] = 1;
  local_108._8_8_ = (element_type *)0x0;
  local_108._16_8_ = 0;
  local_160[0] = false;
  local_168 = (undefined1  [8])&PTR__lazy_ostream_013d7850;
  local_158 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_150._0_8_ =
       "no exceptions thrown by result = RPCConvertValues(\"generatetoaddress\", {\"1\", \"mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a\", \"9\"})"
  ;
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_320 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_108,(lazy_ostream *)local_168,1,1,WARN,_cVar10,
             (size_t)&local_328,0x1a0);
  boost::detail::shared_count::~shared_count((shared_count *)(local_108 + 0x10));
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x1a1;
  file_06.m_begin = (iterator)&local_368;
  msg_06.m_end = pvVar9;
  msg_06.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_378,
             msg_06);
  local_b0[8] = false;
  local_b0._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  pUVar3 = ::UniValue::operator[](&local_90,0);
  local_234._0_4_ = ::UniValue::getInt<int>(pUVar3);
  local_238[0] = '\x01';
  local_238[1] = '\0';
  local_238[2] = '\0';
  local_238[3] = '\0';
  peStack_180 = (element_type *)0x0;
  local_178[0].pi_ = (sp_counted_base *)0x0;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xeeab46;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeeaba1;
  local_190 = (string *)local_234;
  local_160[0] = false;
  local_168 = (undefined1  [8])&PTR__lazy_ostream_013d3e70;
  local_158 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_150._0_8_ = &local_190;
  local_198 = local_238;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108._0_8_ = &PTR__lazy_ostream_013d3e70;
  local_108._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_f0 = (undefined1  [8])&local_198;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_188._0_1_ = (class_property<bool>)(class_property<bool>)(local_234._0_4_ == 1);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_188,(lazy_ostream *)local_b0,1,2,REQUIRE,0xeee48b,
             (size_t)&local_1b0,0x1a1,local_168,"1",local_108);
  boost::detail::shared_count::~shared_count(local_178);
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x1a2;
  file_07.m_begin = (iterator)&local_388;
  msg_07.m_end = pvVar9;
  msg_07.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_398,
             msg_07);
  local_b0[8] = false;
  local_b0._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  pUVar3 = ::UniValue::operator[](&local_90,1);
  psVar4 = ::UniValue::get_str_abi_cxx11_(pUVar3);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (psVar4,"mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a");
  local_188._0_1_ = (class_property<bool>)(iVar2 == 0);
  peStack_180 = (element_type *)0x0;
  local_178[0].pi_ = (sp_counted_base *)0x0;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xeeab46;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeeaba1;
  local_160[0] = false;
  local_168 = (undefined1  [8])&PTR__lazy_ostream_013d3d70;
  local_158 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_150._0_8_ = &local_190;
  local_198 = "mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a";
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108._0_8_ = &PTR__lazy_ostream_013d43f0;
  local_108._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_f0 = (undefined1  [8])&local_198;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_190 = psVar4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_188,(lazy_ostream *)local_b0,1,2,REQUIRE,0xeee4a3,
             (size_t)&local_1b0,0x1a2,local_168,"\"mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a\"",local_108);
  boost::detail::shared_count::~shared_count(local_178);
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x1a3;
  file_08.m_begin = (iterator)&local_3a8;
  msg_08.m_end = pvVar9;
  msg_08.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3b8,
             msg_08);
  local_b0[8] = false;
  local_b0._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  pUVar3 = ::UniValue::operator[](&local_90,2);
  local_234._0_4_ = ::UniValue::getInt<int>(pUVar3);
  local_238[0] = '\t';
  local_238[1] = '\0';
  local_238[2] = '\0';
  local_238[3] = '\0';
  local_188 = (pointer)CONCAT71(local_188._1_7_,local_234._0_4_ == 9);
  peStack_180 = (element_type *)0x0;
  local_178[0].pi_ = (sp_counted_base *)0x0;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xeeab46;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeeaba1;
  local_190 = (string *)local_234;
  local_160[0] = false;
  local_168 = (undefined1  [8])&PTR__lazy_ostream_013d3e70;
  local_158 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_150._0_8_ = &local_190;
  local_198 = local_238;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108._0_8_ = &PTR__lazy_ostream_013d3e70;
  local_108._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_f0 = (undefined1  [8])&local_198;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_188,(lazy_ostream *)local_b0,1,2,REQUIRE,0xeee710,
             (size_t)&local_1b0,0x1a3,local_168,"9",local_108);
  boost::detail::shared_count::~shared_count(local_178);
  local_b0._0_8_ = &local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"generatetoaddress","");
  local_168 = (undefined1  [8])&local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"1","");
  local_150._8_8_ =
       &local_140.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_150 + 8),"mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU","");
  pUVar7 = (pointer)(local_128 + 0x10);
  local_128._0_8_ = pUVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"9","");
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)local_168;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1b0,__l_02,(allocator_type *)&local_190);
  RPCConvertValues((UniValue *)local_108,(string *)local_b0,&local_1b0);
  local_90.typ = local_108._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_90.val,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 8));
  local_178[0].pi_ =
       (sp_counted_base *)
       local_90.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  peStack_180 = (element_type *)
                local_90.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_188 = (pointer)local_90.keys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_188);
  local_178[0].pi_ =
       (sp_counted_base *)
       local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  peStack_180 = (element_type *)
                local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_188 = local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_188);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e0);
  if ((element_type *)local_108._8_8_ != (element_type *)local_f0) {
    operator_delete((void *)local_108._8_8_,(long)local_f0 + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b0);
  lVar5 = -0x60;
  do {
    pUVar1 = pUVar7[-1].values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pUVar7 != pUVar1) {
      operator_delete(pUVar1,*(long *)pUVar7 + 1);
    }
    pUVar7 = (pointer)&pUVar7[-1].keys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._0_8_ != &local_a0) {
    operator_delete((void *)local_b0._0_8_,(ulong)(local_a0._M_allocated_capacity + 1));
  }
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x57f008;
  file_09.m_end = (iterator)0x1a5;
  file_09.m_begin = (iterator)&local_3c8;
  msg_09.m_end = pvVar9;
  msg_09.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3d8,
             msg_09);
  local_108[0] = 1;
  local_108._8_8_ = (element_type *)0x0;
  local_108._16_8_ = 0;
  local_160[0] = false;
  local_168 = (undefined1  [8])&PTR__lazy_ostream_013d7850;
  local_158 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_150._0_8_ =
       "no exceptions thrown by result = RPCConvertValues(\"generatetoaddress\", {\"1\", \"mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU\", \"9\"})"
  ;
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_3e0 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_108,(lazy_ostream *)local_168,1,1,WARN,_cVar10,
             (size_t)&local_3e8,0x1a5);
  boost::detail::shared_count::~shared_count((shared_count *)(local_108 + 0x10));
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x1a6;
  file_10.m_begin = (iterator)&local_428;
  msg_10.m_end = pvVar9;
  msg_10.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_438,
             msg_10);
  local_b0[8] = false;
  local_b0._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  pUVar3 = ::UniValue::operator[](&local_90,0);
  local_234._0_4_ = ::UniValue::getInt<int>(pUVar3);
  local_238[0] = '\x01';
  local_238[1] = '\0';
  local_238[2] = '\0';
  local_238[3] = '\0';
  peStack_180 = (element_type *)0x0;
  local_178[0].pi_ = (sp_counted_base *)0x0;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xeeab46;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeeaba1;
  local_190 = (string *)local_234;
  local_160[0] = false;
  local_168 = (undefined1  [8])&PTR__lazy_ostream_013d3e70;
  local_158 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_150._0_8_ = &local_190;
  local_198 = local_238;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108._0_8_ = &PTR__lazy_ostream_013d3e70;
  local_108._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_f0 = (undefined1  [8])&local_198;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_188._0_1_ = (class_property<bool>)(class_property<bool>)(local_234._0_4_ == 1);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_188,(lazy_ostream *)local_b0,1,2,REQUIRE,0xeee48b,
             (size_t)&local_1b0,0x1a6,local_168,"1",local_108);
  boost::detail::shared_count::~shared_count(local_178);
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x1a7;
  file_11.m_begin = (iterator)&local_448;
  msg_11.m_end = pvVar9;
  msg_11.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_458,
             msg_11);
  local_b0[8] = false;
  local_b0._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  pUVar3 = ::UniValue::operator[](&local_90,1);
  psVar4 = ::UniValue::get_str_abi_cxx11_(pUVar3);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (psVar4,"mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU");
  local_188._0_1_ = (class_property<bool>)(iVar2 == 0);
  peStack_180 = (element_type *)0x0;
  local_178[0].pi_ = (sp_counted_base *)0x0;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xeeab46;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeeaba1;
  local_160[0] = false;
  local_168 = (undefined1  [8])&PTR__lazy_ostream_013d3d70;
  local_158 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_150._0_8_ = &local_190;
  local_198 = "mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU";
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108._0_8_ = &PTR__lazy_ostream_013d43f0;
  local_108._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_f0 = (undefined1  [8])&local_198;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_190 = psVar4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_188,(lazy_ostream *)local_b0,1,2,REQUIRE,0xeee4a3,
             (size_t)&local_1b0,0x1a7,local_168,"\"mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU\"",local_108);
  boost::detail::shared_count::~shared_count(local_178);
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x1a8;
  file_12.m_begin = (iterator)&local_468;
  msg_12.m_end = pvVar9;
  msg_12.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_478,
             msg_12);
  local_b0[8] = false;
  local_b0._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_a0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_a0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  pUVar3 = ::UniValue::operator[](&local_90,2);
  local_234._0_4_ = ::UniValue::getInt<int>(pUVar3);
  local_238[0] = '\t';
  local_238[1] = '\0';
  local_238[2] = '\0';
  local_238[3] = '\0';
  local_188 = (pointer)CONCAT71(local_188._1_7_,local_234._0_4_ == 9);
  peStack_180 = (element_type *)0x0;
  local_178[0].pi_ = (sp_counted_base *)0x0;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xeeab46;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeeaba1;
  local_190 = (string *)local_234;
  local_160[0] = false;
  local_168 = (undefined1  [8])&PTR__lazy_ostream_013d3e70;
  local_158 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_150._0_8_ = &local_190;
  local_198 = local_238;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108._0_8_ = &PTR__lazy_ostream_013d3e70;
  local_108._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_f0 = (undefined1  [8])&local_198;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_188,(lazy_ostream *)local_b0,1,2,REQUIRE,0xeee710,
             (size_t)&local_1b0,0x1a8,local_168,"9",local_108);
  boost::detail::shared_count::~shared_count(local_178);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.val._M_dataplus._M_p != &local_90.val.field_2) {
    operator_delete(local_90.val._M_dataplus._M_p,
                    CONCAT71(local_90.val.field_2._M_allocated_capacity._1_7_,
                             local_90.val.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_convert_values_generatetoaddress)
{
    UniValue result;

    BOOST_CHECK_NO_THROW(result = RPCConvertValues("generatetoaddress", {"101", "mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a"}));
    BOOST_CHECK_EQUAL(result[0].getInt<int>(), 101);
    BOOST_CHECK_EQUAL(result[1].get_str(), "mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a");

    BOOST_CHECK_NO_THROW(result = RPCConvertValues("generatetoaddress", {"101", "mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU"}));
    BOOST_CHECK_EQUAL(result[0].getInt<int>(), 101);
    BOOST_CHECK_EQUAL(result[1].get_str(), "mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU");

    BOOST_CHECK_NO_THROW(result = RPCConvertValues("generatetoaddress", {"1", "mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a", "9"}));
    BOOST_CHECK_EQUAL(result[0].getInt<int>(), 1);
    BOOST_CHECK_EQUAL(result[1].get_str(), "mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a");
    BOOST_CHECK_EQUAL(result[2].getInt<int>(), 9);

    BOOST_CHECK_NO_THROW(result = RPCConvertValues("generatetoaddress", {"1", "mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU", "9"}));
    BOOST_CHECK_EQUAL(result[0].getInt<int>(), 1);
    BOOST_CHECK_EQUAL(result[1].get_str(), "mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU");
    BOOST_CHECK_EQUAL(result[2].getInt<int>(), 9);
}